

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O0

string * benchmark::StringPrintFImp_abi_cxx11_(char *msg,__va_list_tag *args)

{
  pointer pvVar1;
  pointer pcVar2;
  undefined8 *in_RDX;
  char *in_RSI;
  string *in_RDI;
  unique_ptr<char[],_std::default_delete<char[]>_> buff_ptr;
  int ret;
  size_t size;
  array<char,_256UL> local_buff;
  va_list args_cp;
  char *in_stack_fffffffffffffe58;
  unique_ptr<char[],_std::default_delete<char[]>_> *this;
  allocator local_161;
  unique_ptr<char[],_std::default_delete<char[]>_> local_160 [3];
  allocator local_145;
  int local_144;
  size_t local_140;
  array<char,_256UL> local_138;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 *local_18;
  char *local_10;
  
  local_28 = in_RDX[2];
  local_38 = *in_RDX;
  uStack_30 = in_RDX[1];
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_140 = std::array<char,_256UL>::size(&local_138);
  pvVar1 = std::array<char,_256UL>::data((array<char,_256UL> *)0x17d273);
  local_144 = vsnprintf(pvVar1,local_140,local_10,&local_38);
  if (local_144 == 0) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else if ((ulong)(long)local_144 < local_140) {
    pvVar1 = std::array<char,_256UL>::data((array<char,_256UL> *)0x17d2c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pvVar1,&local_145);
    std::allocator<char>::~allocator((allocator<char> *)&local_145);
  }
  else {
    local_140 = (long)local_144 + 1;
    operator_new__(local_140);
    this = local_160;
    std::unique_ptr<char[],std::default_delete<char[]>>::
    unique_ptr<char*,std::default_delete<char[]>,void,bool>(this,in_stack_fffffffffffffe58);
    pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this);
    local_144 = vsnprintf(pcVar2,local_140,local_10,local_18);
    pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar2,&local_161);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(this);
  }
  return in_RDI;
}

Assistant:

std::string StringPrintFImp(const char *msg, va_list args)
{
  // we might need a second shot at this, so pre-emptivly make a copy
  va_list args_cp;
  va_copy(args_cp, args);

  // TODO(ericwf): use std::array for first attempt to avoid one memory
  // allocation guess what the size might be
  std::array<char, 256> local_buff;
  std::size_t size = local_buff.size();
  // 2015-10-08: vsnprintf is used instead of snd::vsnprintf due to a limitation in the android-ndk
  auto ret = vsnprintf(local_buff.data(), size, msg, args_cp);

  va_end(args_cp);

  // handle empty expansion
  if (ret == 0)
    return std::string{};
  if (static_cast<std::size_t>(ret) < size)
    return std::string(local_buff.data());

  // we did not provide a long enough buffer on our first attempt.
  // add 1 to size to account for null-byte in size cast to prevent overflow
  size = static_cast<std::size_t>(ret) + 1;
  auto buff_ptr = std::unique_ptr<char[]>(new char[size]);
  // 2015-10-08: vsnprintf is used instead of snd::vsnprintf due to a limitation in the android-ndk
  ret = vsnprintf(buff_ptr.get(), size, msg, args);
  return std::string(buff_ptr.get());
}